

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::asymm(SimpSolver *this,Var v,CRef cr)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  CRef CVar4;
  Clause *this_00;
  Solver *this_01;
  Lit *pLVar5;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  CRef in_stack_00000010;
  int in_stack_00000014;
  Solver *in_stack_00000018;
  Lit in_stack_00000024;
  bool in_stack_0000003b;
  int i;
  Lit l;
  Clause *c;
  Solver *in_stack_000001f0;
  undefined4 in_stack_ffffffffffffff98;
  Ref in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  lbool b;
  lbool local_39;
  int local_38;
  uint8_t local_31;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar6;
  int i_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CRef cr_00;
  long lVar7;
  Lit l_00;
  
  lVar7 = in_RDI;
  this_00 = ClauseAllocator::operator[]
                      ((ClauseAllocator *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff9c);
  *(long *)(in_RDI + 0x200) = *(long *)(in_RDI + 0x200) + 1;
  uVar2 = Clause::mark(this_00);
  if ((uVar2 == 0) &&
     (bVar1 = Solver::satisfied((Solver *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                (Clause *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
     !bVar1)) {
    this_01 = (Solver *)(in_RDI + 0x360);
    vec<Minisat::Lit>::size((vec<Minisat::Lit> *)(in_RDI + 0x350));
    vec<int>::push((vec<int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar6 = 0;
    while( true ) {
      i_00 = iVar6;
      iVar3 = Clause::size(this_00);
      l_00.x = (int)((ulong)lVar7 >> 0x20);
      if (iVar3 <= iVar6) break;
      pLVar5 = Clause::operator[](this_00,i_00);
      b.value = (uint8_t)((uint)iVar6 >> 0x18);
      iVar6 = var((Lit)pLVar5->x);
      if (iVar6 == in_ESI) {
        Clause::operator[](this_00,i_00);
      }
      else {
        pLVar5 = Clause::operator[](this_00,i_00);
        local_38 = pLVar5->x;
        local_31 = (uint8_t)Solver::value(this_01,(Lit)(int)in_RDI);
        lbool::lbool(&local_39,'\x01');
        bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98),b);
        if (bVar1) {
          pLVar5 = Clause::operator[](this_00,i_00);
          operator~((Lit)pLVar5->x);
          Solver::uncheckedEnqueue
                    (in_stack_00000018,in_stack_00000024,in_stack_00000014,in_stack_00000010);
        }
      }
      iVar6 = i_00 + 1;
    }
    CVar4 = Solver::propagate(in_stack_000001f0);
    cr_00 = (CRef)((ulong)this_00 >> 0x20);
    if (CVar4 == 0xffffffff) {
      Solver::cancelUntil(_l,i,in_stack_0000003b);
    }
    else {
      Solver::cancelUntil(_l,i,in_stack_0000003b);
      *(int *)(in_RDI + 0x1424) = *(int *)(in_RDI + 0x1424) + 1;
      bVar1 = strengthenClause((SimpSolver *)CONCAT44(in_ESI,in_EDX),cr_00,l_00);
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool SimpSolver::asymm(Var v, CRef cr)
{
    Clause &c = ca[cr];
    assert(decisionLevel() == 0);
    statistics.simpSteps++;

    if (c.mark() || satisfied(c)) return true;

    trail_lim.push(trail.size());
    Lit l = lit_Undef;
    for (int i = 0; i < c.size(); i++)
        if (var(c[i]) != v) {
            if (value(c[i]) != l_False) uncheckedEnqueue(~c[i], 0);
        } else
            l = c[i];

    if (propagate() != CRef_Undef) {
        cancelUntil(0);
        asymm_lits++;
        if (!strengthenClause(cr, l)) return false;
    } else
        cancelUntil(0);

    return true;
}